

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

uint64_t VP8LHistogramEstimateBits(VP8LHistogram *h)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  long *in_RDI;
  uint8_t *in_stack_00000008;
  uint32_t *population;
  int length;
  uint64_t cost;
  int i;
  int *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  HistogramIndex in_stack_ffffffffffffffdc;
  VP8LHistogram *in_stack_ffffffffffffffe0;
  long local_18;
  int local_c;
  
  local_18 = 0;
  for (local_c = 0; local_c < 5; local_c = local_c + 1) {
    GetPopulationInfo(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                      (uint32_t **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8);
    uVar3 = PopulationCost((uint32_t *)cost,length,(uint16_t *)population,in_stack_00000008);
    local_18 = uVar3 + local_18;
  }
  uVar1 = (*VP8LExtraCost)((uint32_t *)(*in_RDI + 0x400),0x18);
  uVar2 = (*VP8LExtraCost)((uint32_t *)(in_RDI + 0x181),0x28);
  return (ulong)(uVar1 + uVar2) * 0x800000 + local_18;
}

Assistant:

uint64_t VP8LHistogramEstimateBits(const VP8LHistogram* const h) {
  int i;
  uint64_t cost = 0;
  for (i = 0; i < 5; ++i) {
    int length;
    const uint32_t* population;
    GetPopulationInfo(h, (HistogramIndex)i, &population, &length);
    cost += PopulationCost(population, length, /*trivial_sym=*/NULL,
                           /*is_used=*/NULL);
  }
  cost += ((uint64_t)(VP8LExtraCost(h->literal + NUM_LITERAL_CODES,
                                    NUM_LENGTH_CODES) +
                      VP8LExtraCost(h->distance, NUM_DISTANCE_CODES))
           << LOG_2_PRECISION_BITS);
  return cost;
}